

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256_t *hash,uchar *key,size_t keylen)

{
  long lVar1;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_58 = *(undefined8 *)key;
  uStack_50 = *(undefined8 *)(key + 8);
  local_48 = *(undefined8 *)(key + 0x10);
  uStack_40 = *(undefined8 *)(key + 0x18);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  secp256k1_sha256_initialize(&hash->outer);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    *(byte *)((long)&local_58 + lVar1) = *(byte *)((long)&local_58 + lVar1) ^ 0x5c;
  }
  secp256k1_sha256_write(&hash->outer,(uchar *)&local_58,0x40);
  secp256k1_sha256_initialize(&hash->inner);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    *(byte *)((long)&local_58 + lVar1) = *(byte *)((long)&local_58 + lVar1) ^ 0x6a;
  }
  secp256k1_sha256_write(&hash->inner,(uchar *)&local_58,0x40);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256_t *hash, const unsigned char *key, size_t keylen) {
    int n;
    unsigned char rkey[64];
    if (keylen <= 64) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 64 - keylen);
    } else {
        secp256k1_sha256_t sha256;
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, key, keylen);
        secp256k1_sha256_finalize(&sha256, rkey);
        memset(rkey + 32, 0, 32);
    }

    secp256k1_sha256_initialize(&hash->outer);
    for (n = 0; n < 64; n++) {
        rkey[n] ^= 0x5c;
    }
    secp256k1_sha256_write(&hash->outer, rkey, 64);

    secp256k1_sha256_initialize(&hash->inner);
    for (n = 0; n < 64; n++) {
        rkey[n] ^= 0x5c ^ 0x36;
    }
    secp256k1_sha256_write(&hash->inner, rkey, 64);
    memset(rkey, 0, 64);
}